

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Television.cpp
# Opt level: O0

void __thiscall L15_1::Television::settings(Television *this)

{
  ostream *poVar1;
  void *pvVar2;
  char *pcVar3;
  Television *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"TV is ");
  pcVar3 = "Off";
  if (this->_state == 1) {
    pcVar3 = "On";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if (this->_state == 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Volume setting = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,this->_volume);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Channel setting = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,this->_channel);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Mode = ");
    pcVar3 = "Cable";
    if (this->_mode == 0) {
      pcVar3 = "Antenna";
    }
    poVar1 = std::operator<<(poVar1,pcVar3);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Input = ");
    pcVar3 = "DVD";
    if (this->_input == 0) {
      pcVar3 = "TV";
    }
    poVar1 = std::operator<<(poVar1,pcVar3);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Television::settings() const {
        std::cout << "TV is " << (_state == On ? "On" : "Off") << std::endl;
        if (_state == On) {
            std::cout << "Volume setting = " << _volume << std::endl;
            std::cout << "Channel setting = " << _channel << std::endl;
            std::cout << "Mode = " << (_mode == Antenna ? "Antenna" : "Cable") << std::endl;
            std::cout << "Input = " << (_input == TV ? "TV" : "DVD") << std::endl;
        }
    }